

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

int base64_decode_quartet_using_maps(base64_maps_t *maps,char *dest,char *src)

{
  char cVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  int *piVar6;
  
  cVar1 = maps->decode_map[(byte)*src];
  if (cVar1 == -1) {
    piVar6 = __errno_location();
    *piVar6 = 0x21;
  }
  cVar2 = maps->decode_map[(byte)src[1]];
  if (cVar2 == -1) {
    piVar6 = __errno_location();
    *piVar6 = 0x21;
  }
  cVar3 = maps->decode_map[(byte)src[2]];
  if (cVar3 == -1) {
    piVar6 = __errno_location();
    *piVar6 = 0x21;
  }
  bVar4 = maps->decode_map[(byte)src[3]];
  if (bVar4 == 0xff) {
    piVar6 = __errno_location();
    *piVar6 = 0x21;
    iVar5 = -1;
  }
  else {
    iVar5 = -1;
    if (((cVar1 != -1) && (cVar2 != -1)) && (cVar3 != -1)) {
      *dest = cVar2 >> 4 | cVar1 << 2;
      dest[1] = cVar3 >> 2 | cVar2 << 4;
      dest[2] = bVar4 | cVar3 << 6;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int base64_decode_quartet_using_maps(const base64_maps_t *maps, char dest[3],
				     const char src[4])
{
	signed char a;
	signed char b;
	signed char c;
	signed char d;

	a = sixbit_from_b64(maps, src[0]);
	b = sixbit_from_b64(maps, src[1]);
	c = sixbit_from_b64(maps, src[2]);
	d = sixbit_from_b64(maps, src[3]);

	if ((a == -1) || (b == -1) || (c == -1) || (d == -1)) {
		return -1;
	}

	dest[0] = (a << 2) | (b >> 4);
	dest[1] = ((b & 0xf) << 4) | (c >> 2);
	dest[2] = ((c & 0x3) << 6) | d;

	return 0;
}